

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<int,_int> * __thiscall
Memory::AllocateArray<Memory::Recycler,JsUtil::SimpleHashedEntry<int,int>,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  SimpleHashedEntry<int,_int> *pSVar1;
  
  if (count != 0) {
    pSVar1 = (SimpleHashedEntry<int,_int> *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3d != 0) | count << 3,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    return pSVar1;
  }
  Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
  return (SimpleHashedEntry<int,_int> *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}